

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O3

size_t __thiscall
helics::ActionMessage::fromByteArray(ActionMessage *this,byte *data,size_t buffer_size)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  pointer pbVar4;
  pointer pcVar5;
  size_t __n;
  size_t sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  uint8_t uVar42;
  ActionMessage *pAVar43;
  undefined4 uVar44;
  size_t sVar45;
  ulong __new_size;
  undefined1 *puVar46;
  int iVar47;
  long lVar48;
  ulong uVar49;
  byte *st1;
  byte *pbVar50;
  byte *st1_1;
  ulong uVar51;
  undefined6 uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  baseType timecode;
  Time local_58;
  ActionMessage *local_50;
  ulong local_48;
  ulong local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  if (fromByteArray(std::byte_const*,unsigned_long)::littleEndian == '\0') {
    fromByteArray();
  }
  if (0x2c < buffer_size) {
    bVar1 = *data;
    if (bVar1 == 0xf3) {
      sVar45 = depacketize(this,data,buffer_size);
      if (sVar45 != 0) {
        return sVar45;
      }
      bVar1 = *data;
    }
    uVar42 = fromByteArray::littleEndian;
    if (bVar1 == 0x7b) {
      return 0;
    }
    uVar51 = (ulong)((uint)data[2] << 8 | (uint)data[1] << 0x10);
    bVar2 = data[3];
    uVar49 = uVar51 + bVar2 + 0x2d;
    if (uVar49 <= buffer_size) {
      uVar44 = *(undefined4 *)(data + 4);
      this->messageAction = uVar44;
      if (bVar1 != uVar42) {
        uVar44 = (uint)uVar44 >> 0x18 | (uint)(uVar44 & 0xff0000) >> 8 | (uVar44 & 0xff00) << 8 |
                 uVar44 << 0x18;
        this->messageAction = uVar44;
      }
      uVar51 = uVar51 | bVar2;
      this->messageID = *(undefined4 *)(data + 8);
      (this->source_id).gid = *(undefined4 *)(data + 0xc);
      (this->source_handle).hid = *(undefined4 *)(data + 0x10);
      (this->dest_id).gid = *(undefined4 *)(data + 0x14);
      (this->dest_handle).hid = *(undefined4 *)(data + 0x18);
      this->counter = *(undefined2 *)(data + 0x1c);
      this->flags = *(undefined2 *)(data + 0x1e);
      this->sequenceID = *(undefined4 *)(data + 0x20);
      (this->actionTime).internalTimeCode = *(undefined8 *)(data + 0x24);
      if (uVar44 == 500) {
        uVar49 = uVar51 + 0x45;
        if (buffer_size < uVar49) goto LAB_0033d251;
        (this->Te).internalTimeCode = *(undefined8 *)(data + 0x2c);
        (this->Tdemin).internalTimeCode = *(undefined8 *)(data + 0x34);
        (this->Tso).internalTimeCode = *(undefined8 *)(data + 0x3c);
        pbVar50 = data + 0x44;
      }
      else {
        pbVar50 = data + 0x2c;
        this->Te = 0;
        this->Tdemin = 0;
        (this->Tso).internalTimeCode = 0;
      }
      if (uVar51 != 0) {
        SmallBuffer::reserve(&this->payload,uVar51);
        (this->payload).bufferSize = uVar51;
        memcpy((this->payload).heap,pbVar50,uVar51);
        pbVar50 = pbVar50 + uVar51;
      }
      __new_size = (ulong)*pbVar50;
      this_00 = &this->stringData;
      local_50 = this;
      local_40 = uVar51;
      if (__new_size == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(this_00,(this_00->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        local_48 = __new_size;
        local_38 = this_00;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(this_00,__new_size);
        uVar49 = uVar49 + local_48 * 4;
        if (buffer_size < uVar49) goto LAB_0033d251;
        pbVar50 = pbVar50 + 1;
        iVar47 = (int)local_48;
        uVar51 = 0;
        local_48 = uVar49;
        do {
          uVar44 = *(undefined4 *)pbVar50;
          if (bVar1 != uVar42) {
            uVar44 = (uint)uVar44 >> 0x18 | (uint)(uVar44 & 0xff0000) >> 8 | (uVar44 & 0xff00) << 8
                     | uVar44 << 0x18;
          }
          uVar49 = (ulong)(uint)uVar44;
          local_48 = local_48 + uVar49;
          if (buffer_size < local_48) {
            local_50->messageAction = cmd_invalid;
            return 0;
          }
          pbVar4 = (local_38->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar4->_M_dataplus)._M_p + uVar51),0,
                     *(size_type *)((long)&pbVar4->_M_string_length + uVar51),(char *)(pbVar50 + 4),
                     uVar49);
          pbVar50 = pbVar50 + 4 + uVar49;
          uVar51 = uVar51 + 0x20;
          uVar49 = local_48;
        } while ((uint)(iVar47 << 5) != uVar51);
      }
      pAVar43 = local_50;
      if (bVar1 != uVar42) {
        auVar53._0_4_ = local_50->messageID;
        auVar53._4_4_ = local_50->source_id;
        auVar53._8_4_ = local_50->source_handle;
        auVar53._12_4_ = local_50->dest_id;
        auVar54[1] = 0;
        auVar54[0] = (byte)auVar53._8_4_;
        auVar54[2] = (char)((uint)auVar53._8_4_ >> 8);
        auVar54[3] = 0;
        auVar54[4] = (char)((uint)auVar53._8_4_ >> 0x10);
        auVar54[5] = 0;
        auVar54[6] = (char)((uint)auVar53._8_4_ >> 0x18);
        auVar54[7] = 0;
        auVar54[8] = (char)auVar53._12_4_;
        auVar54[9] = 0;
        auVar54[10] = (char)((uint)auVar53._12_4_ >> 8);
        auVar54[0xb] = 0;
        auVar54[0xc] = (char)((uint)auVar53._12_4_ >> 0x10);
        auVar54[0xd] = 0;
        auVar54[0xe] = (char)((uint)auVar53._12_4_ >> 0x18);
        auVar54[0xf] = 0;
        auVar55 = pshuflw(auVar54,auVar54,0x1b);
        auVar56 = pshufhw(auVar55,auVar55,0x1b);
        auVar24[0xd] = 0;
        auVar24._0_13_ = auVar53._0_13_;
        auVar24[0xe] = (char)((uint)auVar53._4_4_ >> 0x18);
        auVar26[0xc] = (char)((uint)auVar53._4_4_ >> 0x10);
        auVar26._0_12_ = auVar53._0_12_;
        auVar26._13_2_ = auVar24._13_2_;
        auVar28[0xb] = 0;
        auVar28._0_11_ = auVar53._0_11_;
        auVar28._12_3_ = auVar26._12_3_;
        auVar30[10] = (char)((uint)auVar53._4_4_ >> 8);
        auVar30._0_10_ = auVar53._0_10_;
        auVar30._11_4_ = auVar28._11_4_;
        auVar32[9] = 0;
        auVar32._0_9_ = auVar53._0_9_;
        auVar32._10_5_ = auVar30._10_5_;
        auVar34[8] = (char)auVar53._4_4_;
        auVar34._0_8_ = auVar53._0_8_;
        auVar34._9_6_ = auVar32._9_6_;
        auVar36._7_8_ = 0;
        auVar36._0_7_ = auVar34._8_7_;
        auVar38._1_8_ = SUB158(auVar36 << 0x40,7);
        auVar38[0] = (char)((uint)auVar53._0_4_ >> 0x18);
        auVar38._9_6_ = 0;
        auVar39._1_10_ = SUB1510(auVar38 << 0x30,5);
        auVar39[0] = (char)((uint)auVar53._0_4_ >> 0x10);
        auVar39._11_4_ = 0;
        auVar55._3_12_ = SUB1512(auVar39 << 0x20,3);
        auVar55[2] = (char)((uint)auVar53._0_4_ >> 8);
        auVar55[0] = (byte)auVar53._0_4_;
        auVar55[1] = 0;
        auVar55[0xf] = 0;
        auVar53 = pshuflw(auVar55,auVar55,0x1b);
        auVar53 = pshufhw(auVar53,auVar53,0x1b);
        sVar7 = auVar53._0_2_;
        sVar8 = auVar53._2_2_;
        sVar9 = auVar53._4_2_;
        sVar10 = auVar53._6_2_;
        sVar11 = auVar53._8_2_;
        sVar12 = auVar53._10_2_;
        sVar13 = auVar53._12_2_;
        sVar14 = auVar53._14_2_;
        sVar15 = auVar56._0_2_;
        sVar16 = auVar56._2_2_;
        sVar17 = auVar56._4_2_;
        sVar18 = auVar56._6_2_;
        sVar19 = auVar56._8_2_;
        sVar20 = auVar56._10_2_;
        sVar21 = auVar56._12_2_;
        sVar22 = auVar56._14_2_;
        *(char *)&local_50->messageID = (0 < sVar7) * (sVar7 < 0x100) * auVar53[0] - (0xff < sVar7);
        *(char *)((long)&local_50->messageID + 1) =
             (0 < sVar8) * (sVar8 < 0x100) * auVar53[2] - (0xff < sVar8);
        *(char *)((long)&local_50->messageID + 2) =
             (0 < sVar9) * (sVar9 < 0x100) * auVar53[4] - (0xff < sVar9);
        *(char *)((long)&local_50->messageID + 3) =
             (0 < sVar10) * (sVar10 < 0x100) * auVar53[6] - (0xff < sVar10);
        *(char *)&(local_50->source_id).gid =
             (0 < sVar11) * (sVar11 < 0x100) * auVar53[8] - (0xff < sVar11);
        *(char *)((long)&(local_50->source_id).gid + 1) =
             (0 < sVar12) * (sVar12 < 0x100) * auVar53[10] - (0xff < sVar12);
        *(char *)((long)&(local_50->source_id).gid + 2) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar53[0xc] - (0xff < sVar13);
        *(char *)((long)&(local_50->source_id).gid + 3) =
             (0 < sVar14) * (sVar14 < 0x100) * auVar53[0xe] - (0xff < sVar14);
        *(char *)&(local_50->source_handle).hid =
             (0 < sVar15) * (sVar15 < 0x100) * auVar56[0] - (0xff < sVar15);
        *(char *)((long)&(local_50->source_handle).hid + 1) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar56[2] - (0xff < sVar16);
        *(char *)((long)&(local_50->source_handle).hid + 2) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar56[4] - (0xff < sVar17);
        *(char *)((long)&(local_50->source_handle).hid + 3) =
             (0 < sVar18) * (sVar18 < 0x100) * auVar56[6] - (0xff < sVar18);
        *(char *)&(local_50->dest_id).gid =
             (0 < sVar19) * (sVar19 < 0x100) * auVar56[8] - (0xff < sVar19);
        *(char *)((long)&(local_50->dest_id).gid + 1) =
             (0 < sVar20) * (sVar20 < 0x100) * auVar56[10] - (0xff < sVar20);
        *(char *)((long)&(local_50->dest_id).gid + 2) =
             (0 < sVar21) * (sVar21 < 0x100) * auVar56[0xc] - (0xff < sVar21);
        *(char *)((long)&(local_50->dest_id).gid + 3) =
             (0 < sVar22) * (sVar22 < 0x100) * auVar56[0xe] - (0xff < sVar22);
        uVar51._0_4_ = local_50->dest_handle;
        uVar51._4_2_ = local_50->counter;
        uVar51._6_2_ = local_50->flags;
        auVar23._8_6_ = 0;
        auVar23._0_8_ = uVar51;
        auVar23[0xe] = (char)((ushort)uVar51._6_2_ >> 8);
        auVar25._8_4_ = 0;
        auVar25._0_8_ = uVar51;
        auVar25[0xc] = (char)uVar51._6_2_;
        auVar25._13_2_ = auVar23._13_2_;
        auVar27._8_4_ = 0;
        auVar27._0_8_ = uVar51;
        auVar27._12_3_ = auVar25._12_3_;
        auVar29._8_2_ = 0;
        auVar29._0_8_ = uVar51;
        auVar29[10] = (char)((ushort)uVar51._4_2_ >> 8);
        auVar29._11_4_ = auVar27._11_4_;
        auVar31._8_2_ = 0;
        auVar31._0_8_ = uVar51;
        auVar31._10_5_ = auVar29._10_5_;
        auVar33[8] = (char)uVar51._4_2_;
        auVar33._0_8_ = uVar51;
        auVar33._9_6_ = auVar31._9_6_;
        auVar37._7_8_ = 0;
        auVar37._0_7_ = auVar33._8_7_;
        auVar40._1_8_ = SUB158(auVar37 << 0x40,7);
        auVar40[0] = (char)((uint)(undefined4)uVar51 >> 0x18);
        auVar40._9_6_ = 0;
        auVar41._1_10_ = SUB1510(auVar40 << 0x30,5);
        auVar41[0] = (char)((uint)(undefined4)uVar51 >> 0x10);
        auVar41._11_4_ = 0;
        auVar35[2] = (char)((uint)(undefined4)uVar51 >> 8);
        auVar35._0_2_ = (ushort)(undefined4)uVar51;
        auVar35._3_12_ = SUB1512(auVar41 << 0x20,3);
        auVar56._0_2_ = (ushort)(undefined4)uVar51 & 0xff;
        auVar56._2_13_ = auVar35._2_13_;
        auVar56[0xf] = 0;
        auVar53 = pshuflw(auVar56,auVar56,0x1b);
        auVar53 = pshufhw(auVar53,auVar53,0xb1);
        sVar7 = auVar53._0_2_;
        sVar8 = auVar53._2_2_;
        sVar9 = auVar53._4_2_;
        sVar10 = auVar53._6_2_;
        uVar44 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar53[6] - (0xff < sVar10),
                          CONCAT12((0 < sVar9) * (sVar9 < 0x100) * auVar53[4] - (0xff < sVar9),
                                   CONCAT11((0 < sVar8) * (sVar8 < 0x100) * auVar53[2] -
                                            (0xff < sVar8),
                                            (0 < sVar7) * (sVar7 < 0x100) * auVar53[0] -
                                            (0xff < sVar7))));
        sVar7 = auVar53._8_2_;
        sVar8 = auVar53._10_2_;
        uVar52 = CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar53[10] - (0xff < sVar8),
                          CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar53[8] - (0xff < sVar7),
                                   uVar44));
        sVar7 = auVar53._12_2_;
        sVar8 = auVar53._14_2_;
        local_50->dest_handle = (InterfaceHandle)uVar44;
        local_50->counter = (short)((uint6)uVar52 >> 0x20);
        local_50->flags =
             (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar53[0xe] - (0xff < sVar8),
                              CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar53[0xc] - (0xff < sVar7)
                                       ,uVar52)) >> 0x30);
        puVar46 = (undefined1 *)((long)&local_58.internalTimeCode + 7);
        local_58.internalTimeCode = (local_50->actionTime).internalTimeCode;
        lVar48 = 0;
        do {
          uVar3 = *(undefined1 *)((long)&local_58.internalTimeCode + lVar48);
          *(undefined1 *)((long)&local_58.internalTimeCode + lVar48) = *puVar46;
          *puVar46 = uVar3;
          lVar48 = lVar48 + 1;
          puVar46 = puVar46 + -1;
        } while (lVar48 != 4);
        (local_50->actionTime).internalTimeCode = local_58.internalTimeCode;
        if (local_50->messageAction == cmd_time_request) {
          puVar46 = (undefined1 *)((long)&local_58.internalTimeCode + 7);
          local_58.internalTimeCode = (local_50->Te).internalTimeCode;
          lVar48 = 0;
          do {
            uVar3 = *(undefined1 *)((long)&local_58.internalTimeCode + lVar48);
            *(undefined1 *)((long)&local_58.internalTimeCode + lVar48) = *puVar46;
            *puVar46 = uVar3;
            lVar48 = lVar48 + 1;
            puVar46 = puVar46 + -1;
          } while (lVar48 != 4);
          puVar46 = (undefined1 *)((long)&local_58.internalTimeCode + 7);
          (local_50->Te).internalTimeCode = local_58.internalTimeCode;
          local_58.internalTimeCode = (local_50->Tdemin).internalTimeCode;
          lVar48 = 0;
          do {
            uVar3 = *(undefined1 *)((long)&local_58.internalTimeCode + lVar48);
            *(undefined1 *)((long)&local_58.internalTimeCode + lVar48) = *puVar46;
            *puVar46 = uVar3;
            lVar48 = lVar48 + 1;
            puVar46 = puVar46 + -1;
          } while (lVar48 != 4);
          puVar46 = (undefined1 *)((long)&local_58.internalTimeCode + 7);
          (local_50->Tdemin).internalTimeCode = local_58.internalTimeCode;
          local_58.internalTimeCode = (local_50->Tso).internalTimeCode;
          lVar48 = 0;
          do {
            uVar3 = *(undefined1 *)((long)&local_58.internalTimeCode + lVar48);
            *(undefined1 *)((long)&local_58.internalTimeCode + lVar48) = *puVar46;
            *puVar46 = uVar3;
            lVar48 = lVar48 + 1;
            puVar46 = puVar46 + -1;
          } while (lVar48 != 4);
          (local_50->Tso).internalTimeCode = local_58.internalTimeCode;
        }
      }
      if ((int)local_40 != 0xffffff) {
        return uVar49;
      }
      pbVar4 = (local_50->stringData).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((local_50->stringData).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == pbVar4) {
        return uVar49;
      }
      pcVar5 = pbVar4[-1]._M_dataplus._M_p;
      __n = pbVar4[-1]._M_string_length;
      sVar6 = (local_50->payload).bufferSize;
      sVar45 = __n + sVar6;
      SmallBuffer::reserve(&local_50->payload,sVar45);
      (pAVar43->payload).bufferSize = sVar45;
      memcpy((pAVar43->payload).heap + sVar6,pcVar5,__n);
      pbVar4 = (pAVar43->stringData).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (pAVar43->stringData).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
      pcVar5 = pbVar4[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != &pbVar4[-1].field_2) {
        operator_delete(pcVar5,pbVar4[-1].field_2._M_allocated_capacity + 1);
        return uVar49;
      }
      return uVar49;
    }
  }
LAB_0033d251:
  this->messageAction = cmd_invalid;
  return 0;
}

Assistant:

std::size_t ActionMessage::fromByteArray(const std::byte* data, std::size_t buffer_size)
{
    std::size_t tsize{action_message_base_size};
    static const uint8_t littleEndian = isLittleEndian();
    if (buffer_size < tsize) {
        messageAction = CMD_INVALID;
        return (0);
    }
    if (data[0] == static_cast<std::byte>(LEADING_CHAR)) {
        auto res = depacketize(data, buffer_size);
        if (res > 0) {
            return static_cast<int>(res);
        }
    }
    // this means it probably is a JSON packate
    if (data[0] == std::byte{'{'}) {
        return 0;
    }
    const std::size_t size = 256ULL * 256ULL * (std::to_integer<std::size_t>(data[1])) +
        256ULL * std::to_integer<std::size_t>(data[2]) + std::to_integer<std::size_t>(data[3]);
    tsize += size;
    if (buffer_size < tsize) {
        messageAction = CMD_INVALID;
        return (0);
    }
    const bool swap = (data[0] != static_cast<std::byte>(littleEndian));
    data += sizeof(uint32_t);
    memcpy(&messageAction, data, sizeof(action_message_def::action_t));
    // messageAction = *reinterpret_cast<const action_message_def::action_t *> (data);
    if (swap) {
        swap_bytes<sizeof(action_message_def::action_t)>(
            reinterpret_cast<std::uint8_t*>(&messageAction));
    }
    data += sizeof(action_message_def::action_t);
    // messageID = *reinterpret_cast<const int32_t *> (data);
    memcpy(&messageID, data, sizeof(int32_t));
    data += sizeof(int32_t);
    // source_id = GlobalFederateId{*reinterpret_cast<const int32_t *> (data)};
    memcpy(source_id.getBaseTypePointer(), data, sizeof(GlobalFederateId::BaseType));
    data += sizeof(GlobalFederateId);
    // source_handle = InterfaceHandle{*reinterpret_cast<const int32_t *> (data)};
    memcpy(source_handle.getBaseTypePointer(), data, sizeof(InterfaceHandle::BaseType));
    data += sizeof(InterfaceHandle);
    // dest_id = GlobalFederateId{*reinterpret_cast<const int32_t *> (data)};
    memcpy(dest_id.getBaseTypePointer(), data, sizeof(GlobalFederateId::BaseType));
    data += sizeof(GlobalFederateId);
    // dest_handle = InterfaceHandle{*reinterpret_cast<const int32_t *> (data)};
    memcpy(dest_handle.getBaseTypePointer(), data, sizeof(InterfaceHandle::BaseType));
    data += sizeof(InterfaceHandle);
    // counter = *reinterpret_cast<const uint16_t *> (data);
    memcpy(&counter, data, sizeof(uint16_t));
    data += sizeof(uint16_t);
    // flags = *reinterpret_cast<const uint16_t *> (data);
    memcpy(&flags, data, sizeof(uint16_t));
    data += sizeof(uint16_t);
    // sequenceID = *reinterpret_cast<const uint32_t *> (data);
    memcpy(&sequenceID, data, sizeof(uint32_t));
    data += sizeof(uint32_t);
    Time::baseType btc;
    memcpy(&btc, data, sizeof(Time::baseType));
    actionTime.setBaseTimeCode(btc);
    data += sizeof(Time::baseType);

    if (messageAction == CMD_TIME_REQUEST) {
        tsize += 3 * sizeof(Time::baseType);
        if (buffer_size < tsize) {
            messageAction = CMD_INVALID;
            return (0);
        }
        memcpy(&btc, data, sizeof(Time::baseType));
        Te.setBaseTimeCode(btc);
        data += sizeof(Time::baseType);
        memcpy(&btc, data, sizeof(Time::baseType));
        Tdemin.setBaseTimeCode(btc);
        data += sizeof(Time::baseType);
        memcpy(&btc, data, sizeof(Time::baseType));
        Tso.setBaseTimeCode(btc);
        data += sizeof(Time::baseType);
    } else {
        Te = timeZero;
        Tdemin = timeZero;
        Tso = timeZero;
    }
    if (size > 0) {
        payload.assign(data, size);
        data += size;
    }
    auto stringCount = std::to_integer<std::size_t>(*data);
    ++data;
    if (stringCount != 0) {
        stringData.resize(stringCount);
        tsize += 4 * stringCount;
        if (buffer_size < tsize) {
            messageAction = CMD_INVALID;
            return (0);
        }

        for (std::size_t ii = 0; ii < stringCount; ++ii) {
            uint32_t ssize;
            memcpy(&ssize, data, sizeof(uint32_t));
            data += sizeof(uint32_t);
            if (swap) {
                swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&ssize));
            }
            tsize += ssize;
            if (buffer_size < tsize) {
                messageAction = CMD_INVALID;
                return (0);
            }
            stringData[ii].assign(reinterpret_cast<const char*>(data), ssize);
            data += ssize;
        }
    } else {
        stringData.clear();
    }

    if (swap) {
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&messageID));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&source_id));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&source_handle));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&dest_id));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&dest_handle));
        swap_bytes<2>(reinterpret_cast<std::uint8_t*>(&counter));
        swap_bytes<2>(reinterpret_cast<std::uint8_t*>(&flags));
        auto timecode = actionTime.getBaseTimeCode();
        swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
        actionTime.setBaseTimeCode(timecode);
        if (messageAction == CMD_TIME_REQUEST) {
            timecode = Te.getBaseTimeCode();
            swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
            Te.setBaseTimeCode(timecode);
            timecode = Tdemin.getBaseTimeCode();
            swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
            Tdemin.setBaseTimeCode(timecode);
            timecode = Tso.getBaseTimeCode();
            swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
            Tso.setBaseTimeCode(timecode);
        }
    }
    if (size == maxPayloadSize && !stringData.empty()) {
        payload.append(stringData.back());
        stringData.pop_back();
    }
    return tsize;
}